

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCatalogSetDefaultPrefer(void)

{
  int iVar1;
  xmlCatalogPrefer val;
  xmlCatalogPrefer val_00;
  int iVar2;
  int local_1c;
  int n_prefer;
  xmlCatalogPrefer prefer;
  xmlCatalogPrefer ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = XML_CATA_PREFER_NONE;
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    iVar1 = xmlMemBlocks();
    val = gen_xmlCatalogPrefer(local_1c,0);
    val_00 = xmlCatalogSetDefaultPrefer(val);
    desret_xmlCatalogPrefer(val_00);
    call_tests = call_tests + 1;
    des_xmlCatalogPrefer(local_1c,val,0);
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogSetDefaultPrefer",(ulong)(uint)(iVar2 - iVar1));
      ret_val = ret_val + XML_CATA_PREFER_PUBLIC;
      printf(" %d");
      printf("\n");
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlCatalogSetDefaultPrefer(void) {
    int test_ret = 0;

#if defined(LIBXML_CATALOG_ENABLED)
    int mem_base;
    xmlCatalogPrefer ret_val;
    xmlCatalogPrefer prefer; /* the default preference for delegation */
    int n_prefer;

    for (n_prefer = 0;n_prefer < gen_nb_xmlCatalogPrefer;n_prefer++) {
        mem_base = xmlMemBlocks();
        prefer = gen_xmlCatalogPrefer(n_prefer, 0);

        ret_val = xmlCatalogSetDefaultPrefer(prefer);
        desret_xmlCatalogPrefer(ret_val);
        call_tests++;
        des_xmlCatalogPrefer(n_prefer, prefer, 0);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlCatalogSetDefaultPrefer",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_prefer);
            printf("\n");
        }
    }
    function_tests++;
#endif

    return(test_ret);
}